

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldh_join_ti_impl.h
# Opt level: O2

void __thiscall
join::
LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::verify_candidates(LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
                    *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          *trees_collection,
                   vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
                   vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                   *join_result,double distance_threshold)

{
  pair<int,_int> *__args;
  pair<int,_int> *ppVar1;
  int *__args_1;
  double ted_value;
  AlgsCostModel cm;
  AlgsTreeIndex ti_1;
  LabelDictionary<label::StringLabel> ld;
  TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ted_algorithm;
  AlgsTreeIndex ti_2;
  double local_1c0;
  UnitCostModelLD<label::StringLabel> local_1b8;
  TreeIndexTouzetBaseline local_1b0;
  LabelDictionary<label::StringLabel> local_158;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  local_100;
  TreeIndexTouzetBaseline local_88;
  
  local_158.label_to_id_dictionary_._M_h._M_buckets =
       &local_158.label_to_id_dictionary_._M_h._M_single_bucket;
  local_158.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  local_158.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.label_to_id_dictionary_._M_h._M_element_count = 0;
  local_158.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_158.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  local_158.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_158.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_158.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_158.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_158._76_8_ = 0;
  local_100.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ._vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0012eb40;
  local_1b0.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super_PostLToDepth.postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super_PostLToSize.postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_PostLToLabelId.postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (candidates->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_1b8.ld_ = &local_158;
  local_100.
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  .c_ = &local_1b8;
  for (__args_1 = &((candidates->
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    _M_impl.super__Vector_impl_data._M_start)->second;
      __args = (pair<int,_int> *)(__args_1 + -1), __args != ppVar1; __args_1 = __args_1 + 2) {
    node::
    index_tree<node::TreeIndexTouzetBaseline,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              (&local_1b0,
               (trees_collection->
               super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
               )._M_impl.super__Vector_impl_data._M_start + __args->first,&local_158,&local_1b8);
    node::
    index_tree<node::TreeIndexTouzetBaseline,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              (&local_88,
               (trees_collection->
               super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
               )._M_impl.super__Vector_impl_data._M_start + *__args_1,&local_158,&local_1b8);
    local_1c0 = ted::
                TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                ::ted_k((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
                         *)&local_100,&local_1b0,&local_88,(int)distance_threshold);
    if (local_1c0 <= distance_threshold) {
      std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>::
      emplace_back<int_const&,int_const&,double&>
                ((vector<join::JoinResultElement,std::allocator<join::JoinResultElement>> *)
                 join_result,(int *)__args,__args_1,&local_1c0);
    }
    this->sum_subproblem_counter_ =
         this->sum_subproblem_counter_ +
         local_100.
         super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
         .subproblem_counter_;
  }
  node::TreeIndexTouzetBaseline::~TreeIndexTouzetBaseline(&local_88);
  node::TreeIndexTouzetBaseline::~TreeIndexTouzetBaseline(&local_1b0);
  ted::
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>
  ::~TEDAlgorithmTouzet(&local_100);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary(&local_158);
  return;
}

Assistant:

void LDHJoinTI<Label, VerificationAlgorithm>::verify_candidates(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {

  label::LabelDictionary<Label> ld;
  typename VerificationAlgorithm::AlgsCostModel cm(ld);
  VerificationAlgorithm ted_algorithm(cm);
  typename VerificationAlgorithm::AlgsTreeIndex ti_1;
  typename VerificationAlgorithm::AlgsTreeIndex ti_2;

  // Verify each pair in the candidate set
  for(const auto& pair: candidates) {
    node::index_tree(ti_1, trees_collection[pair.first], ld, cm);
    node::index_tree(ti_2, trees_collection[pair.second], ld, cm);
    double ted_value = ted_algorithm.ted_k(ti_1, ti_2, distance_threshold);
    if(ted_value <= distance_threshold)
      join_result.emplace_back(pair.first, pair.second, ted_value);
    // Sum up all number of subproblems
    sum_subproblem_counter_ += ted_algorithm.get_subproblem_count();
  }
}